

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O0

void write_symlist(wchar_t fd,curses_symdef *list,wchar_t len)

{
  size_t __n;
  undefined8 uVar1;
  wchar_t local_12c;
  char local_128 [4];
  wchar_t i;
  char buf [256];
  wchar_t len_local;
  curses_symdef *list_local;
  wchar_t fd_local;
  
  for (local_12c = L'\0'; local_12c < len; local_12c = local_12c + L'\x01') {
    uVar1 = 0x23;
    if (list[local_12c].custom != '\0') {
      uVar1 = 0x21;
    }
    sprintf(local_128,"%c\"%s\"\t%d\t%04x\n",uVar1,list[local_12c].symname,
            (ulong)(uint)list[local_12c].color,(ulong)(uint)list[local_12c].unichar[0]);
    __n = strlen(local_128);
    write(fd,local_128,__n);
  }
  return;
}

Assistant:

static void write_symlist(int fd, const struct curses_symdef *list, int len)
{
    char buf[BUFSZ];
    int i;
    
    for (i = 0; i < len; i++) {
	sprintf(buf, "%c\"%s\"\t%d\t%04x\n", list[i].custom ? '!' : '#',
		list[i].symname, list[i].color, list[i].unichar[0]);
	write(fd, buf, strlen(buf));
    }
}